

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Init
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  InnerMap *pIVar1;
  undefined8 *in_RDI;
  size_t n;
  size_t in_stack_fffffffffffffeb0;
  ArenaImpl *allocated_type;
  Arena *in_stack_fffffffffffffec0;
  ArenaImpl *this_00;
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_128;
  undefined1 local_11d;
  undefined4 local_11c [3];
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *local_110;
  undefined1 *local_108;
  undefined4 *local_100;
  ArenaImpl *local_f8;
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *local_f0;
  undefined1 *local_e8;
  undefined4 *local_e0;
  ArenaImpl *local_d8;
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *local_d0;
  undefined1 *local_c8;
  undefined4 *local_c0;
  ArenaImpl *local_b8;
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *local_b0;
  undefined1 *local_a8;
  undefined4 *local_a0;
  ArenaImpl *local_98;
  Arena *local_80;
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *local_78;
  undefined1 *local_70;
  undefined4 *local_68;
  ArenaImpl *local_60;
  InnerMap *local_58;
  Arena *local_50;
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *local_48;
  undefined1 *local_40;
  undefined4 *local_38;
  undefined1 local_29;
  ArenaImpl *local_28;
  size_t local_20;
  byte local_11;
  ArenaImpl *local_10;
  InnerMap *local_8;
  
  allocated_type = (ArenaImpl *)*in_RDI;
  local_11c[0] = 0;
  MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::MapAllocator(&local_128,(Arena *)*in_RDI);
  local_100 = local_11c;
  local_108 = &local_11d;
  local_110 = &local_128;
  local_f8 = allocated_type;
  local_f0 = local_110;
  local_e8 = local_108;
  local_e0 = local_100;
  local_d8 = allocated_type;
  local_d0 = local_110;
  local_c8 = local_108;
  local_c0 = local_100;
  local_b8 = allocated_type;
  local_b0 = local_110;
  local_a8 = local_108;
  local_a0 = local_100;
  local_98 = allocated_type;
  local_78 = local_110;
  local_70 = local_108;
  local_68 = local_100;
  local_60 = allocated_type;
  if (allocated_type == (ArenaImpl *)0x0) {
    pIVar1 = (InnerMap *)operator_new(0x30);
    local_80 = local_78->arena_;
    InnerMap::InnerMap(pIVar1,*local_68,local_80);
    local_58 = pIVar1;
  }
  else {
    local_29 = 0;
    local_11 = 0;
    this_00 = allocated_type;
    local_48 = local_110;
    local_40 = local_108;
    local_38 = local_100;
    local_28 = allocated_type;
    local_10 = allocated_type;
    local_20 = internal::AlignUpTo8(0x30);
    Arena::AllocHook(in_stack_fffffffffffffec0,(type_info *)allocated_type,in_stack_fffffffffffffeb0
                    );
    if ((local_11 & 1) == 0) {
      local_8 = (InnerMap *)
                internal::ArenaImpl::AllocateAlignedAndAddCleanup
                          (this_00,(size_t)in_RDI,(_func_void_void_ptr *)in_stack_fffffffffffffec0);
    }
    else {
      local_8 = (InnerMap *)internal::ArenaImpl::AllocateAligned(this_00,(size_t)in_RDI);
    }
    local_50 = local_48->arena_;
    InnerMap::InnerMap(local_8,*local_38,local_50);
    local_58 = local_8;
  }
  in_RDI[2] = local_58;
  return;
}

Assistant:

void Init() {
    elements_ =
        Arena::Create<InnerMap>(arena_, 0u, hasher(), Allocator(arena_));
  }